

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFun.cpp
# Opt level: O3

void testd(double d,bool changeExpected)

{
  undefined7 in_register_00000039;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  putchar(10);
  dVar1 = (double)Imath_3_2::succd(d);
  dVar2 = (double)Imath_3_2::predd(d);
  dVar3 = (double)Imath_3_2::predd(d);
  uVar4 = Imath_3_2::succd(dVar3);
  dVar3 = (double)Imath_3_2::succd(d);
  uVar5 = Imath_3_2::predd(dVar3);
  printf("d   %0.18lg %lx\n",d);
  printf("sd  %0.18lg %lx\n",dVar1);
  printf("pd  %0.18lg %lx\n",dVar2);
  printf("spd %0.18lg %lx\n",uVar4);
  printf("psd %0.18lg %lx\n",uVar5);
  fflush(_stdout);
  if ((int)CONCAT71(in_register_00000039,changeExpected) == 0) {
    if (NAN(d)) {
      if (!NAN(dVar2)) {
        __assert_fail("isnan (pd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x71,"void testd(double, bool)");
      }
      if (!NAN(dVar1)) {
        __assert_fail("isnan (sd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x72,"void testd(double, bool)");
      }
    }
    else {
      if (dVar2 != d) {
        __assert_fail("bit_cast<uint64_t> (pd) == bit_cast<uint64_t> (d)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x77,"void testd(double, bool)");
      }
      if (dVar1 != d) {
        __assert_fail("bit_cast<uint64_t> (sd) == bit_cast<uint64_t> (d)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x78,"void testd(double, bool)");
      }
    }
  }
  else {
    if (d <= dVar2) {
      __assert_fail("pd < d",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x68,"void testd(double, bool)");
    }
    if (dVar1 <= d) {
      __assert_fail("d < sd",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x69,"void testd(double, bool)");
    }
  }
  return;
}

Assistant:

void
testd (double d, bool changeExpected = true)
{
    printf ("\n");

    double sd = IMATH_INTERNAL_NAMESPACE::succd (d);
    double pd = IMATH_INTERNAL_NAMESPACE::predd (d);
    double spd =
        IMATH_INTERNAL_NAMESPACE::succd (IMATH_INTERNAL_NAMESPACE::predd (d));
    double psd =
        IMATH_INTERNAL_NAMESPACE::predd (IMATH_INTERNAL_NAMESPACE::succd (d));

    printf ("d   %0.18lg %" PRIx64 "\n", d, bit_cast<uint64_t> (d));
    printf ("sd  %0.18lg %" PRIx64 "\n", sd, bit_cast<uint64_t> (sd));
    printf ("pd  %0.18lg %" PRIx64 "\n", pd, bit_cast<uint64_t> (pd));
    printf ("spd %0.18lg %" PRIx64 "\n", spd, bit_cast<uint64_t> (spd));
    printf ("psd %0.18lg %" PRIx64 "\n", psd, bit_cast<uint64_t> (psd));

    fflush (stdout);

    if (changeExpected)
    {
        assert (pd < d);
        assert (d < sd);
    }
    else
    {
        if (isnan (d))
        {
            // If f is nan, pf and sf may be converted from signaling
            // to quiet nan, but they'll still be nan's.
            assert (isnan (pd));
            assert (isnan (sd));
        }
        else
        {
            // No bit change expected if input was inf.
            assert (bit_cast<uint64_t> (pd) == bit_cast<uint64_t> (d));
            assert (bit_cast<uint64_t> (sd) == bit_cast<uint64_t> (d));
        }
    }
}